

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::escapeControlSequence(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  string *str_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; uVar1 = std::__cxx11::string::size(), local_28 < uVar1; local_28 = local_28 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == '\a') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\x07");
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar2 == '\b') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\x08");
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if (*pcVar2 == '\t') {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
          if (*pcVar2 == '\v') {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\x0b");
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
            if (*pcVar2 == '\f') {
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\x0c");
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
              if (*pcVar2 == '\\') {
                uVar1 = std::__cxx11::string::size();
                if (local_28 + 1 < uVar1) {
                  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
                  if ((*pcVar2 == '\"') ||
                     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\''
                     )) {
                    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
                    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
                  }
                  else {
                    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
                  }
                }
                else {
                  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
                }
              }
              else {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
                std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeControlSequence(const std::string &str) {
  std::string s;

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\a') {
      s += "\\x07";
    } else if (str[i] == '\b') {
      s += "\\x08";
    } else if (str[i] == '\t') {
      s += "\\t";
    } else if (str[i] == '\v') {
      s += "\\x0b";
    } else if (str[i] == '\f') {
      s += "\\x0c";
    } else if (str[i] == '\\') {
      // skip escaping backshash for escaped quote string: \' \"
      if (i + 1 < str.size()) {
        if ((str[i + 1] == '"') || (str[i + 1] == '\'')) {
          s += str[i];
        } else {
          s += "\\\\";
        }
      } else {
        s += "\\\\";
      }
    } else {
      s += str[i];
    }
  }

  return s;
}